

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O0

void nivalis::anon_unknown_3::ast_sub_var(ASTNode **ast,uint64_t var_id,double value,AST *out)

{
  reference pvVar1;
  size_t sVar2;
  double in_RDX;
  ASTNode **in_RSI;
  AST *in_RDI;
  anon_union_8_3_343d95dd_for_ASTNode_1 in_XMM0_Qa;
  size_t i;
  uint32_t opcode;
  ASTNode **init_pos;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_stack_ffffffffffffffc0
  ;
  value_type *in_stack_ffffffffffffffc8;
  ulong uVar3;
  ulong uVar4;
  undefined4 in_stack_ffffffffffffffd0;
  uint32_t opcode_00;
  AST *out_00;
  anon_union_8_3_343d95dd_for_ASTNode_1 var_id_00;
  
  opcode_00 = ((in_RDI->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_start)->opcode;
  out_00 = in_RDI;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
            ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
             CONCAT44(opcode_00,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  var_id_00 = in_XMM0_Qa;
  if ((opcode_00 == 2) &&
     ((ASTNode **)
      (((in_RDI->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_start)->field_1).ref == in_RSI)) {
    pvVar1 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::back
                       (in_stack_ffffffffffffffc0);
    pvVar1->opcode = 1;
    var_id_00 = in_XMM0_Qa;
    pvVar1 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::back
                       ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_XMM0_Qa);
    pvVar1->field_1 = in_XMM0_Qa;
  }
  (in_RDI->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
  _M_impl.super__Vector_impl_data._M_start =
       (in_RDI->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
       ._M_impl.super__Vector_impl_data._M_start + 1;
  uVar3 = 0;
  while( true ) {
    uVar4 = uVar3;
    sVar2 = OpCode::n_args(opcode_00);
    if (sVar2 <= uVar3) break;
    ast_sub_var(in_RSI,var_id_00.ref,in_RDX,out_00);
    uVar3 = uVar4 + 1;
  }
  return;
}

Assistant:

void ast_sub_var(const Expr::ASTNode** ast, uint64_t var_id, double value, Expr::AST& out) {
    const auto* init_pos = ast;
    auto opcode = (*ast)->opcode;
    out.push_back(**ast);
    if (opcode == OpCode::ref &&
        (*ast)->ref == var_id) {
        out.back().opcode = OpCode::val;
        out.back().val = value;
    }

    ++*ast;
    for (size_t i = 0; i < OpCode::n_args(opcode); ++i) {
        ast_sub_var(ast, var_id, value, out);
    }
}